

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageLoader.cpp
# Opt level: O3

bool __thiscall
sf::priv::ImageLoader::saveImageToFile
          (ImageLoader *this,string *filename,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *pixels,Vector2u *size)

{
  uint x;
  uint y;
  bool bVar1;
  int iVar2;
  long lVar3;
  ostream *poVar4;
  char *pcVar5;
  string extension;
  char *local_68;
  long local_60;
  char local_58 [8];
  undefined8 uStack_50;
  char *local_48;
  long local_40;
  char local_38 [8];
  undefined8 uStack_30;
  
  if ((((pixels->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_start ==
        (pixels->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_finish) || (size->x == 0)) || (size->y == 0)) goto LAB_001d44b2;
  lVar3 = std::__cxx11::string::rfind((char)filename,0x2e);
  if (lVar3 == -1) {
    local_68 = local_58;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"");
  }
  else {
    std::__cxx11::string::substr((ulong)&local_48,(ulong)filename);
    pcVar5 = local_48;
    if (local_40 == 0) {
      local_60 = 0;
    }
    else {
      do {
        iVar2 = tolower((int)*pcVar5);
        *pcVar5 = (char)iVar2;
        pcVar5 = pcVar5 + 1;
        local_60 = local_40;
      } while (pcVar5 != local_48 + local_40);
    }
    local_68 = local_48;
    if (local_48 == local_38) {
      uStack_50 = uStack_30;
      local_68 = local_58;
    }
    local_40 = 0;
    local_38[0] = '\0';
    local_48 = local_38;
  }
  x = size->x;
  y = size->y;
  iVar2 = std::__cxx11::string::compare((char *)&local_68);
  if (iVar2 == 0) {
    iVar2 = stbi_write_bmp((filename->_M_dataplus)._M_p,x,y,4,
                           (pixels->
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_start);
LAB_001d446d:
    if (iVar2 == 0) {
LAB_001d4495:
      bVar1 = true;
    }
    else {
      bVar1 = false;
    }
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)&local_68);
    if (iVar2 == 0) {
      iVar2 = stbi_write_tga((filename->_M_dataplus)._M_p,x,y,4,
                             (pixels->
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                             _M_impl.super__Vector_impl_data._M_start);
      goto LAB_001d446d;
    }
    iVar2 = std::__cxx11::string::compare((char *)&local_68);
    if (iVar2 != 0) {
      iVar2 = std::__cxx11::string::compare((char *)&local_68);
      if ((iVar2 == 0) || (iVar2 = std::__cxx11::string::compare((char *)&local_68), iVar2 == 0)) {
        iVar2 = stbi_write_jpg((filename->_M_dataplus)._M_p,x,y,4,
                               (pixels->
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                               _M_impl.super__Vector_impl_data._M_start,0x5a);
        goto LAB_001d446d;
      }
      goto LAB_001d4495;
    }
    bVar1 = false;
    iVar2 = stbi_write_png((filename->_M_dataplus)._M_p,x,y,4,
                           (pixels->
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_start,0);
    if (iVar2 == 0) goto LAB_001d4495;
  }
  if (local_68 != local_58) {
    operator_delete(local_68);
  }
  if (!bVar1) {
    return true;
  }
LAB_001d44b2:
  poVar4 = err();
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Failed to save image \"",0x16);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,(filename->_M_dataplus)._M_p,filename->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  return false;
}

Assistant:

bool ImageLoader::saveImageToFile(const std::string& filename, const std::vector<Uint8>& pixels, const Vector2u& size)
{
    // Make sure the image is not empty
    if (!pixels.empty() && (size.x > 0) && (size.y > 0))
    {
        // Deduce the image type from its extension

        // Extract the extension
        const std::size_t dot = filename.find_last_of('.');
        const std::string extension = dot != std::string::npos ? toLower(filename.substr(dot + 1)) : "";
        const Vector2i convertedSize = Vector2i(size);

        if (extension == "bmp")
        {
            // BMP format
            if (stbi_write_bmp(filename.c_str(), convertedSize.x, convertedSize.y, 4, &pixels[0]))
                return true;
        }
        else if (extension == "tga")
        {
            // TGA format
            if (stbi_write_tga(filename.c_str(), convertedSize.x, convertedSize.y, 4, &pixels[0]))
                return true;
        }
        else if (extension == "png")
        {
            // PNG format
            if (stbi_write_png(filename.c_str(), convertedSize.x, convertedSize.y, 4, &pixels[0], 0))
                return true;
        }
        else if (extension == "jpg" || extension == "jpeg")
        {
            // JPG format
            if (stbi_write_jpg(filename.c_str(), convertedSize.x, convertedSize.y, 4, &pixels[0], 90))
                return true;
        }
    }

    err() << "Failed to save image \"" << filename << "\"" << std::endl;
    return false;
}